

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr_internal::join(linked_ptr_internal *this,linked_ptr_internal *ptr)

{
  MutexBase *local_28;
  linked_ptr_internal *p;
  MutexLock lock;
  linked_ptr_internal *ptr_local;
  linked_ptr_internal *this_local;
  
  lock.mutex_ = (MutexBase *)ptr;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)&p,(MutexBase *)g_linked_ptr_mutex);
  local_28 = lock.mutex_;
  while( true ) {
    if ((MutexBase *)(local_28->mutex_).__align == lock.mutex_) {
      (local_28->mutex_).__align = (long)this;
      this->next_ = (linked_ptr_internal *)lock.mutex_;
      GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&p);
      return;
    }
    if ((linked_ptr_internal *)(local_28->mutex_).__align == this) break;
    local_28 = (MutexBase *)(local_28->mutex_).__align;
  }
  __assert_fail("p->next_ != this && \"Trying to join() a linked ring we are already in. \" \"Is GMock thread safety enabled?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/include/gtest/internal/gtest-linked_ptr.h"
                ,0x74,
                "void testing::internal::linked_ptr_internal::join(const linked_ptr_internal *)");
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    linked_ptr_internal const* p = ptr;
    while (p->next_ != ptr) {
      assert(p->next_ != this &&
             "Trying to join() a linked ring we are already in. "
             "Is GMock thread safety enabled?");
      p = p->next_;
    }
    p->next_ = this;
    next_ = ptr;
  }